

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,BoundedZCIS input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  MessageLite *msg_00;
  undefined1 local_b0 [8];
  ParseContext ctx;
  char *ptr;
  ParseFlags parse_flags_local;
  MessageLite *msg_local;
  BoundedZCIS input_local;
  
  msg_00 = input._8_8_;
  input_local.zcis._0_4_ = input.zcis._0_4_;
  msg_local = (MessageLite *)this;
  iVar2 = io::CodedInputStream::GetDefaultRecursionLimit();
  ParseContext::ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
            ((ParseContext *)local_b0,iVar2,true,(char **)&ctx.data_.arena,
             (ZeroCopyInputStream **)&msg_local,(int *)&input_local);
  iVar2 = (*msg_00->_vptr_MessageLite[10])(msg_00,ctx.data_.arena,local_b0);
  ctx.data_.arena = (Arena *)CONCAT44(extraout_var,iVar2);
  if (ctx.data_.arena == (Arena *)0x0) {
    input_local._15_1_ = 0;
  }
  else {
    EpsCopyInputStream::BackUp((EpsCopyInputStream *)local_b0,(char *)ctx.data_.arena);
    bVar1 = EpsCopyInputStream::EndedAtLimit((EpsCopyInputStream *)local_b0);
    if (bVar1) {
      input_local._15_1_ =
           anon_unknown_13::CheckFieldPresence((ParseContext *)local_b0,msg_00,(ParseFlags)msg);
    }
    else {
      input_local._15_1_ = 0;
    }
  }
  return (bool)input_local._15_1_;
}

Assistant:

bool MergeFromImpl(BoundedZCIS input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input.zcis, input.limit);
  ptr = msg->_InternalParse(ptr, &ctx);
  if (PROTOBUF_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (PROTOBUF_PREDICT_TRUE(ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}